

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

void testing::internal::PrintOnOneLine(char *str,int max_length)

{
  char cVar1;
  long lVar2;
  int iVar3;
  uint uVar4;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (str != (char *)0x0) {
    uVar4 = 0;
    while( true ) {
      cVar1 = *str;
      if (cVar1 == 0) break;
      if (0xf9 < uVar4) {
        if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
          printf("...");
          return;
        }
        goto LAB_00153a69;
      }
      if (cVar1 == '\n') {
        printf("\\n");
        iVar3 = 2;
      }
      else {
        putchar((int)cVar1);
        iVar3 = 1;
      }
      uVar4 = uVar4 + iVar3;
      str = str + 1;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00153a69:
  __stack_chk_fail();
}

Assistant:

static void PrintOnOneLine(const char* str, int max_length) {
  if (str != NULL) {
    for (int i = 0; *str != '\0'; ++str) {
      if (i >= max_length) {
        printf("...");
        break;
      }
      if (*str == '\n') {
        printf("\\n");
        i += 2;
      } else {
        printf("%c", *str);
        ++i;
      }
    }
  }
}